

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall dlib::image_display::on_wheel_down(image_display *this,unsigned_long state)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  rectangle *prVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  rectangle result;
  
  if (this->drawing_rect == false) {
    if ((state & 0x10) == 0) {
      scrollable_region::on_wheel_down(&this->super_scrollable_region,state);
      return;
    }
    bVar3 = rectangle::contains(&(this->super_scrollable_region).super_drawable.rect,
                                *(this->super_scrollable_region).super_drawable.lastx,
                                *(this->super_scrollable_region).super_drawable.lasty);
    if (((bVar3) && ((this->super_scrollable_region).super_drawable.hidden == false)) &&
       ((this->super_scrollable_region).super_drawable.enabled == true)) {
      if (this->zoom_in_scale == 1) {
        lVar6 = (this->img).nc_;
        lVar8 = (this->img).nr_;
        if (lVar6 < lVar8) {
          lVar6 = lVar8;
        }
        if (lVar6 / this->zoom_out_scale < 0xb) {
          return;
        }
        lVar6 = *(this->super_scrollable_region).super_drawable.lastx;
        lVar8 = *(this->super_scrollable_region).super_drawable.lasty;
        prVar4 = scrollable_region::total_rect(&this->super_scrollable_region);
        lVar7 = prVar4->l;
        lVar1 = prVar4->t;
        lVar2 = this->zoom_out_scale;
        lVar5 = (lVar2 * 10) / 9 + 1;
        this->zoom_out_scale = lVar5;
        scrollable_region::set_total_rect_size
                  (&this->super_scrollable_region,(this->img).nc_ / lVar5,(this->img).nr_ / lVar5);
        prVar4 = scrollable_region::total_rect(&this->super_scrollable_region);
        lVar7 = (((lVar6 - lVar7) * lVar2) / this->zoom_out_scale - lVar6) + prVar4->l;
        lVar6 = (((lVar8 - lVar1) * lVar2) / this->zoom_out_scale - lVar8) + prVar4->t;
        prVar4 = scrollable_region::display_rect(&this->super_scrollable_region);
        result.t = prVar4->t + lVar6;
        result.b = lVar6 + prVar4->b;
        result.l = prVar4->l + lVar7;
        result.r = lVar7 + prVar4->r;
      }
      else {
        lVar6 = *(this->super_scrollable_region).super_drawable.lastx;
        lVar8 = *(this->super_scrollable_region).super_drawable.lasty;
        prVar4 = scrollable_region::total_rect(&this->super_scrollable_region);
        lVar7 = prVar4->l;
        lVar1 = prVar4->t;
        lVar2 = this->zoom_in_scale;
        lVar5 = 1;
        if (0x12 < lVar2 * 9 + 9U) {
          lVar5 = (lVar2 * 9) / 10;
        }
        this->zoom_in_scale = lVar5;
        scrollable_region::set_total_rect_size
                  (&this->super_scrollable_region,(this->img).nc_ * lVar5,lVar5 * (this->img).nr_);
        prVar4 = scrollable_region::total_rect(&this->super_scrollable_region);
        lVar6 = (((lVar6 - lVar7) / lVar2) * this->zoom_in_scale - lVar6) + prVar4->l;
        lVar8 = (((lVar8 - lVar1) / lVar2) * this->zoom_in_scale - lVar8) + prVar4->t;
        prVar4 = scrollable_region::display_rect(&this->super_scrollable_region);
        result.t = prVar4->t + lVar8;
        result.b = lVar8 + prVar4->b;
        result.l = prVar4->l + lVar6;
        result.r = lVar6 + prVar4->r;
      }
      scrollable_region::scroll_to_rect(&this->super_scrollable_region,&result);
    }
  }
  return;
}

Assistant:

void image_display::
    on_wheel_down (
        unsigned long state
    )
    {
        // disable mouse wheel if the user is drawing a rectangle
        if (drawing_rect)
            return;

        // if CONTROL is not being held down
        if ((state & base_window::CONTROL) == 0)
        {
            scrollable_region::on_wheel_down(state);
            return;
        }

        if (rect.contains(lastx,lasty) == false || hidden || !enabled)
            return;


        if (zoom_in_scale != 1)
        {
            const point mouse_loc(lastx, lasty);
            // the pixel in img that the mouse is over
            const point pix_loc = (mouse_loc - total_rect().tl_corner())/zoom_in_scale;

            zoom_in_scale = zoom_in_scale*9/10;
            if (zoom_in_scale == 0)
                zoom_in_scale = 1;

            set_total_rect_size(img.nc()*zoom_in_scale, img.nr()*zoom_in_scale);

            // make is to the pixel under the mouse doesn't move while we zoom
            const point delta = total_rect().tl_corner() - (mouse_loc - pix_loc*zoom_in_scale);
            scroll_to_rect(translate_rect(display_rect(), delta)); 
        }
        else if (std::max(img.nr(), img.nc())/zoom_out_scale > 10)
        {
            const point mouse_loc(lastx, lasty);
            // the pixel in img that the mouse is over
            const point pix_loc = (mouse_loc - total_rect().tl_corner())*zoom_out_scale;

            zoom_out_scale = zoom_out_scale*10/9 + 1;

            set_total_rect_size(img.nc()/zoom_out_scale, img.nr()/zoom_out_scale);

            // make is to the pixel under the mouse doesn't move while we zoom
            const point delta = total_rect().tl_corner() - (mouse_loc - pix_loc/zoom_out_scale);
            scroll_to_rect(translate_rect(display_rect(), delta)); 
        }
    }